

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3JoinType(Parse *pParse,Token *pA,Token *pB,Token *pC)

{
  undefined8 *puVar1;
  int iVar2;
  long in_RCX;
  long in_RDX;
  undefined8 in_RSI;
  Parse *in_RDI;
  long in_FS_OFFSET;
  bool bVar3;
  char *zSp2;
  char *zSp1;
  int j;
  int i;
  Token *p;
  int jointype;
  Token *apAll [3];
  char *local_70;
  char *local_68;
  int local_60;
  int local_5c;
  uint local_4c;
  long local_28 [4];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_4c = 0;
  local_5c = 0;
  do {
    bVar3 = false;
    if (local_5c < 3) {
      bVar3 = local_28[local_5c] != 0;
    }
    if (!bVar3) goto LAB_001b68d3;
    puVar1 = (undefined8 *)local_28[local_5c];
    for (local_60 = 0; local_60 < 7; local_60 = local_60 + 1) {
      if ((*(uint *)(puVar1 + 1) == (uint)sqlite3JoinType::aKeyword[local_60].nChar) &&
         (iVar2 = sqlite3_strnicmp((char *)*puVar1,
                                   "naturaleftouterightfullinnercross" +
                                   sqlite3JoinType::aKeyword[local_60].i,*(int *)(puVar1 + 1)),
         iVar2 == 0)) {
        local_4c = sqlite3JoinType::aKeyword[local_60].code | local_4c;
        break;
      }
    }
    if (6 < local_60) {
      local_4c = local_4c | 0x80;
LAB_001b68d3:
      if ((((local_4c & 0x21) == 0x21) || ((local_4c & 0x80) != 0)) || ((local_4c & 0x38) == 0x20))
      {
        local_68 = " ";
        local_70 = " ";
        if (in_RDX == 0) {
          local_68 = "";
        }
        if (in_RCX == 0) {
          local_70 = "";
        }
        sqlite3ErrorMsg(in_RDI,"unknown join type: %T%s%T%s%T",in_RSI,local_68,in_RDX,local_70,
                        in_RCX);
        local_4c = 1;
      }
      if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
        __stack_chk_fail();
      }
      return local_4c;
    }
    local_5c = local_5c + 1;
  } while( true );
}

Assistant:

SQLITE_PRIVATE int sqlite3JoinType(Parse *pParse, Token *pA, Token *pB, Token *pC){
  int jointype = 0;
  Token *apAll[3];
  Token *p;
                             /*   0123456789 123456789 123456789 123 */
  static const char zKeyText[] = "naturaleftouterightfullinnercross";
  static const struct {
    u8 i;        /* Beginning of keyword text in zKeyText[] */
    u8 nChar;    /* Length of the keyword in characters */
    u8 code;     /* Join type mask */
  } aKeyword[] = {
    /* (0) natural */ { 0,  7, JT_NATURAL                },
    /* (1) left    */ { 6,  4, JT_LEFT|JT_OUTER          },
    /* (2) outer   */ { 10, 5, JT_OUTER                  },
    /* (3) right   */ { 14, 5, JT_RIGHT|JT_OUTER         },
    /* (4) full    */ { 19, 4, JT_LEFT|JT_RIGHT|JT_OUTER },
    /* (5) inner   */ { 23, 5, JT_INNER                  },
    /* (6) cross   */ { 28, 5, JT_INNER|JT_CROSS         },
  };
  int i, j;
  apAll[0] = pA;
  apAll[1] = pB;
  apAll[2] = pC;
  for(i=0; i<3 && apAll[i]; i++){
    p = apAll[i];
    for(j=0; j<ArraySize(aKeyword); j++){
      if( p->n==aKeyword[j].nChar
          && sqlite3StrNICmp((char*)p->z, &zKeyText[aKeyword[j].i], p->n)==0 ){
        jointype |= aKeyword[j].code;
        break;
      }
    }
    testcase( j==0 || j==1 || j==2 || j==3 || j==4 || j==5 || j==6 );
    if( j>=ArraySize(aKeyword) ){
      jointype |= JT_ERROR;
      break;
    }
  }
  if(
     (jointype & (JT_INNER|JT_OUTER))==(JT_INNER|JT_OUTER) ||
     (jointype & JT_ERROR)!=0 ||
     (jointype & (JT_OUTER|JT_LEFT|JT_RIGHT))==JT_OUTER
  ){
    const char *zSp1 = " ";
    const char *zSp2 = " ";
    if( pB==0 ){ zSp1++; }
    if( pC==0 ){ zSp2++; }
    sqlite3ErrorMsg(pParse, "unknown join type: "
       "%T%s%T%s%T", pA, zSp1, pB, zSp2, pC);
    jointype = JT_INNER;
  }
  return jointype;
}